

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out)

{
  char *pcVar1;
  size_type index;
  __copy_move<false,false,std::random_access_iterator_tag> *this_00;
  __type _Var2;
  long lVar3;
  const_reference pvVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  string_type name;
  regex_error local_88;
  source_location local_48;
  
  pcVar1 = cur->_M_current;
  if (pcVar1 == end._M_current) {
    bVar7 = false;
  }
  else {
    cur->_M_current = pcVar1 + 1;
    bVar7 = *pcVar1 == '<';
  }
  detail::ensure_(bVar7,error_badmark,"invalid named back-reference",
                  "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                  ,0x530);
  pcVar1 = cur->_M_current;
  lVar3 = 0;
  pcVar5 = pcVar1;
  do {
    if (pcVar5 == end._M_current) {
      bVar7 = false;
LAB_001341a7:
      pcVar5 = 
      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
      ;
      detail::ensure_(bVar7,error_badmark,"invalid named back-reference",
                      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                      ,0x535);
      cur->_M_current = cur->_M_current + 1;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&name,pcVar1);
      lVar3 = 0;
      uVar6 = 0;
      while( true ) {
        if ((ulong)((*(long *)(this + 0xc0) - *(long *)(this + 0xb8)) / 0x28) <= uVar6) {
          regex_error::regex_error(&local_88,error_badmark,"invalid named back-reference");
          local_48.file_ =
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
          ;
          local_48.function_ =
               "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
          ;
          local_48.line_ = 0x541;
          local_48.column_ = 0;
          throw_exception<boost::xpressive::regex_error>(&local_88,&local_48);
        }
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*(long *)(this + 0xb8) + lVar3),&name);
        if (_Var2) break;
        uVar6 = uVar6 + 1;
        lVar3 = lVar3 + 0x28;
      }
      index = *(size_type *)(*(long *)(this + 0xb8) + 0x20 + lVar3);
      pvVar4 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(this + 8),index);
      this_00 = (__copy_move<false,false,std::random_access_iterator_tag> *)
                (pvVar4->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).first._M_current;
      pvVar4 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(this + 8),index);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char_const*,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                (__return_storage_ptr__,this_00,
                 (pvVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current,pcVar5,out);
      std::__cxx11::string::~string((string *)&name);
      return __return_storage_ptr__;
    }
    if (*pcVar5 == '>') {
      bVar7 = lVar3 != 0;
      goto LAB_001341a7;
    }
    pcVar5 = pcVar5 + 1;
    cur->_M_current = pcVar5;
    lVar3 = lVar3 + -1;
  } while( true );
}

Assistant:

OutputIterator format_named_backref_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        BOOST_XPR_ENSURE_(cur != end && BOOST_XPR_CHAR_(char_type, '<') == *cur++
            , error_badmark, "invalid named back-reference");
        ForwardIterator begin = cur;
        for(; cur != end && BOOST_XPR_CHAR_(char_type, '>') != *cur; ++cur)
        {}
        BOOST_XPR_ENSURE_(cur != begin && cur != end && BOOST_XPR_CHAR_(char_type, '>') == *cur
            , error_badmark, "invalid named back-reference");

        string_type name(begin, cur++);
        for(std::size_t i = 0; i < this->named_marks_.size(); ++i)
        {
            if(this->named_marks_[i].name_ == name)
            {
                std::size_t sub = this->named_marks_[i].mark_nbr_;
                return std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
        }

        BOOST_THROW_EXCEPTION(regex_error(error_badmark, "invalid named back-reference"));
        // Should never get here
        return out;
    }